

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_NtkBoxNum(Bac_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_NtkObjNum(p);
  iVar2 = Vec_StrCountSmallerLit(&p->vType,'\x05');
  return iVar1 - iVar2;
}

Assistant:

static inline int            Bac_NtkBoxNum( Bac_Ntk_t * p )                  { return Bac_NtkObjNum(p) - Vec_StrCountSmallerLit(&p->vType, (char)BAC_OBJ_BOX);             }